

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O0

void __thiscall xray_re::xr_sound_env_object::save(xr_sound_env_object *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_sound_env_object *this_local;
  
  xr_custom_object::save((xr_custom_object *)this,w);
  xr_writer::w_chunk<unsigned_short>(w,0x1001,&SOUNDENV_VERSION);
  xr_writer::open_chunk(w,0x1003);
  xr_writer::w_sz(w,&this->m_inner);
  xr_writer::w_sz(w,&this->m_outer);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_sound_env_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SOUNDENV_CHUNK_VERSION, SOUNDENV_VERSION);
	w.open_chunk(SOUNDENV_CHUNK_ENV_REFS);
	w.w_sz(m_inner);
	w.w_sz(m_outer);
	w.close_chunk();
}